

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O0

StringList * __thiscall
Args::HelpPrinter::createUsageString(HelpPrinter *this,ArgIface *arg,bool required)

{
  bool bVar1;
  byte bVar2;
  byte in_CL;
  long *in_RDX;
  StringList *in_RDI;
  String usage;
  StringList *result;
  parameter_type in_stack_fffffffffffffe78;
  QList<Args::String> *in_stack_fffffffffffffe80;
  undefined1 local_c0 [166];
  byte local_1a;
  byte local_19;
  long *local_18;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  local_18 = in_RDX;
  QList<Args::String>::QList((QList<Args::String> *)0x11dd64);
  String::String((String *)0x11dd71);
  if ((local_19 & 1) == 0) {
    String::String((String *)in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
    String::append((String *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    String::~String((String *)0x11ddbb);
  }
  (**(code **)(*local_18 + 0x38))();
  bVar1 = String::empty((String *)0x11de37);
  if (!bVar1) {
    String::String((String *)in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
    String::append((String *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    String::~String((String *)0x11de85);
    (**(code **)(*local_18 + 0x38))();
    String::append((String *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    (**(code **)(*local_18 + 0x40))();
    bVar1 = String::empty((String *)0x11ded3);
    if (!bVar1) {
      String::String((String *)in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
      String::append((String *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      String::~String((String *)0x11df21);
      QList<Args::String>::push_back(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      String::clear((String *)0x11df42);
    }
  }
  (**(code **)(*local_18 + 0x40))();
  bVar1 = String::empty((String *)0x11dfb6);
  if (bVar1) {
    (**(code **)(*local_18 + 0x38))();
    bVar1 = String::empty((String *)0x11e07d);
    if (bVar1) {
      (**(code **)(*local_18 + 0x40))();
      bVar1 = String::empty((String *)0x11e0b2);
      if (bVar1) {
        (**(code **)(*local_18 + 0x18))(local_c0);
        String::append((String *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
        String::~String((String *)0x11e101);
      }
    }
  }
  else {
    String::String((String *)in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
    String::append((String *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    String::~String((String *)0x11e004);
    (**(code **)(*local_18 + 0x40))();
    String::append((String *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  }
  bVar2 = (**(code **)(*local_18 + 0x20))();
  if ((bVar2 & 1) != 0) {
    String::String((String *)in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
    String::append((String *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    String::~String((String *)0x11e189);
    in_stack_fffffffffffffe80 = (QList<Args::String> *)(**(code **)(*local_18 + 0x48))();
    String::append((String *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    String::String((String *)in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
    String::append((String *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    String::~String((String *)0x11e1ef);
  }
  if ((local_19 & 1) == 0) {
    String::String((String *)in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78);
    String::append((String *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    String::~String((String *)0x11e281);
  }
  QList<Args::String>::push_back(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  local_1a = 1;
  String::~String((String *)0x11e2cf);
  if ((local_1a & 1) == 0) {
    QList<Args::String>::~QList((QList<Args::String> *)0x11e2f4);
  }
  return in_RDI;
}

Assistant:

inline StringList
HelpPrinter::createUsageString( ArgIface * arg, bool required ) const
{
	StringList result;

	String usage;

	if( !required )
		usage.append( SL( "[ " ) );

	if( !arg->flag().empty() )
	{
		usage.append( SL( "-" ) );
		usage.append( arg->flag() );

		if( !arg->argumentName().empty() )
		{
			usage.append( SL( "," ) );

			result.push_back( usage );

			usage.clear();
		}
	}

	if( !arg->argumentName().empty() )
	{
		usage.append( SL( "--" ) );
		usage.append( arg->argumentName() );
	}
	else if( arg->flag().empty() && arg->argumentName().empty() )
		usage.append( arg->name() );

	if( arg->isWithValue() )
	{
		usage.append( SL( " <" ) );
		usage.append( arg->valueSpecifier() );
		usage.append( SL( ">" ) );
	}

	if( !required )
		usage.append( SL( " ]" ) );

	result.push_back( usage );

	return result;
}